

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  ostream *poVar2;
  undefined1 local_a8 [8];
  CTape tape;
  string magicPhrase;
  long local_30;
  long local_28 [2];
  
  magicPhrase._M_dataplus._M_p = (pointer)0x0;
  magicPhrase._M_string_length._0_1_ = 0;
  tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&magicPhrase._M_string_length;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'H');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,
             (string *)&tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count,cVar1);
  CTape::CTape((CTape *)local_a8,0x1e);
  CTape::produce((string *)((long)&magicPhrase.field_2 + 8),(CTape *)local_a8,
                 (string *)&tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)magicPhrase.field_2._8_8_,local_30);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((long *)magicPhrase.field_2._8_8_ != local_28) {
    operator_delete((void *)magicPhrase.field_2._8_8_,local_28[0] + 1);
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *)&tape.m_pos);
  if (local_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a8,
                    (long)tape.m_tape.super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_a8);
  }
  if ((size_type *)tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      &magicPhrase._M_string_length) {
    operator_delete((void *)tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    CONCAT71(magicPhrase._M_string_length._1_7_,
                             (undefined1)magicPhrase._M_string_length) + 1);
  }
  return 0;
}

Assistant:

int main()
{
    string magicPhrase;
    getline(cin, magicPhrase);

    CTape tape;

    cout << tape.produce(magicPhrase) << endl;

    return 0;
}